

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_expr_sizeof(CPState *cp,CPValue *k,int wantsz)

{
  int iVar1;
  CTypeID CVar2;
  CTInfo CVar3;
  CTypeID in_EDX;
  CTState *in_RSI;
  CPState *in_RDI;
  CTInfo info;
  CTSize sz;
  CPState *in_stack_00000650;
  undefined4 in_stack_ffffffffffffffd8;
  ErrMsg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_18;
  
  iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  if (iVar1 == 0) {
    cp_expr_unary((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (CPValue *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  }
  else {
    iVar1 = cp_istypedecl(in_RDI);
    if (iVar1 == 0) {
      cp_expr_comma((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (CPValue *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    else {
      CVar2 = cp_decl_abstract(in_stack_00000650);
      *(CTypeID *)((long)&in_RSI->tab + 4) = CVar2;
    }
    cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
  }
  CVar3 = lj_ctype_info_raw(in_RSI,in_EDX,
                            (CTSize *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
  ;
  if (in_EDX == 0) {
    *(int *)&in_RSI->tab = 1 << ((byte)(CVar3 >> 0x10) & 0xf);
  }
  else if (local_18 == -1) {
    if (*(int *)((long)&in_RSI->tab + 4) != 0x14) {
      cp_err((CPState *)CONCAT44(CVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    }
  }
  else {
    *(int *)&in_RSI->tab = local_18;
  }
  *(undefined4 *)((long)&in_RSI->tab + 4) = 10;
  return;
}

Assistant:

static void cp_expr_sizeof(CPState *cp, CPValue *k, int wantsz)
{
  CTSize sz;
  CTInfo info;
  if (cp_opt(cp, '(')) {
    if (cp_istypedecl(cp))
      k->id = cp_decl_abstract(cp);
    else
      cp_expr_comma(cp, k);
    cp_check(cp, ')');
  } else {
    cp_expr_unary(cp, k);
  }
  info = lj_ctype_info_raw(cp->cts, k->id, &sz);
  if (wantsz) {
    if (sz != CTSIZE_INVALID)
      k->u32 = sz;
    else if (k->id != CTID_A_CCHAR)  /* Special case for sizeof("string"). */
      cp_err(cp, LJ_ERR_FFI_INVSIZE);
  } else {
    k->u32 = 1u << ctype_align(info);
  }
  k->id = CTID_UINT32;  /* Really size_t. */
}